

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::
ValidateNamingStyle<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  undefined8 descriptor;
  bool bVar1;
  string_view name;
  anon_class_16_2_1b71c50a local_90;
  VoidPtr local_80;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_78;
  string_view local_70;
  string_view local_50;
  undefined1 local_40 [8];
  string error;
  DescriptorProto *proto_local;
  Descriptor *message_local;
  DescriptorBuilder *this_local;
  
  error.field_2._8_8_ = proto;
  proto_local = (DescriptorProto *)message;
  message_local = (Descriptor *)this;
  std::__cxx11::string::string((string *)local_40);
  local_50 = Descriptor::name((Descriptor *)proto_local);
  name._M_str = local_40;
  name._M_len = (size_t)local_50._M_str;
  bVar1 = anon_unknown_24::IsValidTitleCaseName
                    ((anon_unknown_24 *)local_50._M_len,name,(string *)local_50._M_len);
  if (!bVar1) {
    local_70 = Descriptor::name((Descriptor *)proto_local);
    descriptor = error.field_2._8_8_;
    local_90.message = (Descriptor **)&proto_local;
    local_90.error = (string *)local_40;
    absl::lts_20250127::FunctionRef<std::__cxx11::string()>::
    FunctionRef<google::protobuf::DescriptorBuilder::ValidateNamingStyle<google::protobuf::Descriptor,google::protobuf::DescriptorProto>(google::protobuf::Descriptor_const*,google::protobuf::DescriptorProto_const&)::__0,void>
              ((FunctionRef<std::__cxx11::string()> *)&local_80,&local_90);
    make_error.invoker_ = p_Stack_78;
    make_error.ptr_.obj = local_80.obj;
    AddError(this,local_70,(Message *)descriptor,NAME,make_error);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void DescriptorBuilder::ValidateNamingStyle(const Descriptor* message,
                                            const DescriptorProto& proto) {
  std::string error;
  if (!IsValidTitleCaseName(message->name(), &error)) {
    AddError(message->name(), proto, DescriptorPool::ErrorCollector::NAME, [&] {
      return absl::StrCat("Message name ", message->name(), " ", error,
                          kNamingStyleOptOutMessage);
    });
  }
}